

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.c
# Opt level: O3

unsigned_long_long ncr(int n,int k)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (n < k) {
    return 0;
  }
  if (k != 0) {
    lVar2 = (long)n;
    uVar3 = 2;
    if (2 < (long)k + 1U) {
      uVar3 = (long)k + 1U;
    }
    uVar4 = 1;
    uVar1 = 1;
    do {
      uVar1 = uVar1 * lVar2;
      lVar2 = lVar2 + -1;
      uVar1 = uVar1 / uVar4;
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
    return uVar1;
  }
  return 1;
}

Assistant:

unsigned long long
ncr(int n, int k) {
    if (k > n) {
        return 0;
    }
    unsigned long long r = 1;
    for (unsigned long long d = 1; d <= k; ++d) {
        r *= n--;
        r /= d;
    }
    return r;
}